

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholding.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ClassConfidenceThresholding::MergeFrom
          (ClassConfidenceThresholding *this,ClassConfidenceThresholding *from)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/ClassConfidenceThresholding.pb.cc"
               ,0xbe);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
            (&(this->precisionrecallcurves_).super_RepeatedPtrFieldBase,
             &(from->precisionrecallcurves_).super_RepeatedPtrFieldBase);
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void ClassConfidenceThresholding::MergeFrom(const ClassConfidenceThresholding& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ClassConfidenceThresholding)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  precisionrecallcurves_.MergeFrom(from.precisionrecallcurves_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}